

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O1

int32_t icu_63::offsetStrToMillis(UnicodeString *str,UErrorCode *status)

{
  short sVar1;
  bool bVar2;
  int32_t iVar3;
  int32_t iVar4;
  int iVar5;
  char16_t *pcVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  
  if (U_ZERO_ERROR < *status) {
    return 0;
  }
  sVar1 = (str->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar9 = (str->fUnion).fFields.fLength;
  }
  else {
    uVar9 = (int)sVar1 >> 5;
  }
  bVar2 = true;
  iVar7 = 0;
  if ((uVar9 & 0xfffffffd) == 5) {
    if (((int)sVar1 & 2U) == 0) {
      pcVar6 = (str->fUnion).fFields.fArray;
    }
    else {
      pcVar6 = (str->fUnion).fStackFields.fBuffer;
    }
    if (*pcVar6 == L'+') {
      iVar8 = 1000;
    }
    else {
      iVar4 = 0;
      iVar5 = 0;
      iVar8 = 0;
      iVar7 = 0;
      if (*pcVar6 != L'-') goto LAB_0020c33e;
      iVar8 = -1000;
    }
    iVar3 = parseAsciiDigits(str,1,2,status);
    iVar4 = parseAsciiDigits(str,3,2,status);
    iVar5 = 0;
    if (uVar9 == 7) {
      iVar5 = parseAsciiDigits(str,5,2,status);
    }
    bVar2 = U_ZERO_ERROR < *status;
    iVar7 = iVar3 * 0x3c;
  }
  else {
    iVar4 = 0;
    iVar5 = 0;
    iVar8 = 0;
  }
LAB_0020c33e:
  if (bVar2) {
    *status = U_INVALID_FORMAT_ERROR;
    iVar4 = 0;
  }
  else {
    iVar4 = iVar8 * ((iVar4 + iVar7) * 0x3c + iVar5);
  }
  return iVar4;
}

Assistant:

static int32_t offsetStrToMillis(const UnicodeString& str, UErrorCode& status) {
    if (U_FAILURE(status)) {
        return 0;
    }

    UBool isValid = FALSE;
    int32_t sign = 0, hour = 0, min = 0, sec = 0;

    do {
        int length = str.length();
        if (length != 5 && length != 7) {
            // utf-offset must be 5 or 7 characters
            break;
        }
        // sign
        UChar s = str.charAt(0);
        if (s == PLUS) {
            sign = 1;
        } else if (s == MINUS) {
            sign = -1;
        } else {
            // utf-offset must start with "+" or "-"
            break;
        }
        hour = parseAsciiDigits(str, 1, 2, status);
        min = parseAsciiDigits(str, 3, 2, status);
        if (length == 7) {
            sec = parseAsciiDigits(str, 5, 2, status);
        }
        if (U_FAILURE(status)) {
            break;
        }
        isValid = true;
    } while(false);

    if (!isValid) {
        status = U_INVALID_FORMAT_ERROR;
        return 0;
    }
    int32_t millis = sign * ((hour * 60 + min) * 60 + sec) * 1000;
    return millis;
}